

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Thing_SetConversation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  FStrifeDialogueNode *pFVar2;
  AActor *pAVar3;
  
  if (arg1 == 0) {
    iVar1 = -1;
    pFVar2 = (FStrifeDialogueNode *)0x0;
  }
  else {
    iVar1 = GetConversation(arg1);
    if (iVar1 == -1) {
      return 0;
    }
    pFVar2 = StrifeDialogues.Array[iVar1];
  }
  if (arg0 == 0) {
    if (it != (AActor *)0x0) {
      it->ConversationRoot = iVar1;
      it->Conversation = pFVar2;
    }
  }
  else {
    for (pAVar3 = AActor::TIDHash[arg0 & 0x7f]; pAVar3 != (AActor *)0x0; pAVar3 = pAVar3->inext) {
      if (pAVar3->tid == arg0) {
        pAVar3->ConversationRoot = iVar1;
        pAVar3->Conversation = pFVar2;
      }
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_SetConversation)
// Thing_SetConversation (tid, dlg_id)
{
	int dlg_index = -1;
	FStrifeDialogueNode *node = NULL;

	if (arg1 != 0)
	{
		dlg_index = GetConversation(arg1);	
		if (dlg_index == -1) return false;
		node = StrifeDialogues[dlg_index];
	}

	if (arg0 != 0)
	{
		FActorIterator iterator (arg0);
		while ((it = iterator.Next()) != NULL)
		{
			it->ConversationRoot = dlg_index;
			it->Conversation = node;
		}
	}
	else if (it)
	{
		it->ConversationRoot = dlg_index;
		it->Conversation = node;
	}
	return true;
}